

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uc.c
# Opt level: O0

uc_err uc_hook_del(uc_engine *uc,uc_hook hh)

{
  _Bool _Var1;
  int __init_ret;
  hook *hook;
  int i;
  uc_hook hh_local;
  uc_engine *uc_local;
  
  if ((((uc->init_done ^ 0xffU) & 1) == 0) ||
     (uc_local._4_4_ = uc_init_engine(uc), uc_local._4_4_ == UC_ERR_OK)) {
    for (hook._4_4_ = 0; hook._4_4_ < 0x12; hook._4_4_ = hook._4_4_ + 1) {
      _Var1 = list_exists(uc->hook + hook._4_4_,(void *)hh);
      if (_Var1) {
        g_hash_table_foreach(*(GHashTable **)(hh + 0x38),hook_invalidate_region,uc);
        g_hash_table_remove_all(*(GHashTable **)(hh + 0x38));
        *(undefined1 *)(hh + 0x14) = 1;
        uc->hooks_count[hook._4_4_] = uc->hooks_count[hook._4_4_] + -1;
        hook_append(&uc->hooks_to_del,(hook *)hh);
      }
    }
    uc_local._4_4_ = UC_ERR_OK;
  }
  return uc_local._4_4_;
}

Assistant:

UNICORN_EXPORT
uc_err uc_hook_del(uc_engine *uc, uc_hook hh)
{
    int i;
    struct hook *hook = (struct hook *)hh;

    UC_INIT(uc);

    // we can't dereference hook->type if hook is invalid
    // so for now we need to iterate over all possible types to remove the hook
    // which is less efficient
    // an optimization would be to align the hook pointer
    // and store the type mask in the hook pointer.
    for (i = 0; i < UC_HOOK_MAX; i++) {
        if (list_exists(&uc->hook[i], (void *)hook)) {
            g_hash_table_foreach(hook->hooked_regions, hook_invalidate_region,
                                 uc);
            g_hash_table_remove_all(hook->hooked_regions);
            hook->to_delete = true;
            uc->hooks_count[i]--;
            hook_append(&uc->hooks_to_del, hook);
        }
    }

    return UC_ERR_OK;
}